

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O0

int Curl_parsenetrc(char *host,char **loginp,char **passwordp,char *netrcfile)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  __uid_t __uid;
  int iVar6;
  FILE *__stream;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  char local_14c8 [4];
  int netrcbuffsize;
  char netrcbuffer [4096];
  _Bool done;
  char *tok_buf;
  char *tok;
  char pwbuf [1024];
  passwd *pw_res;
  passwd pw;
  char *home;
  int local_60;
  _Bool home_alloc;
  int state_our_login;
  char state_password;
  char state_login;
  host_lookup_state state;
  _Bool netrc_alloc;
  _Bool password_alloc;
  _Bool login_alloc;
  _Bool specific_login;
  char *password;
  char *login;
  int retcode;
  FILE *file;
  char *netrcfile_local;
  char **passwordp_local;
  char **loginp_local;
  char *host_local;
  
  login._4_4_ = 1;
  password = *loginp;
  _state = *passwordp;
  bVar8 = false;
  if (password != (char *)0x0) {
    bVar8 = *password != '\0';
  }
  bVar3 = false;
  bVar5 = false;
  bVar1 = false;
  state_our_login = 0;
  bVar2 = false;
  bVar4 = false;
  local_60 = 0;
  file = (FILE *)netrcfile;
  if (netrcfile == (char *)0x0) {
    bVar1 = false;
    pw.pw_shell = curl_getenv("HOME");
    if (pw.pw_shell == (char *)0x0) {
      __uid = geteuid();
      iVar6 = getpwuid_r(__uid,(passwd *)&pw_res,(char *)&tok,0x400,(passwd **)(pwbuf + 0x3f8));
      if ((iVar6 == 0) && (pwbuf._1016_8_ != 0)) {
        pw.pw_shell = (*Curl_cstrdup)(pw.pw_gecos);
        if (pw.pw_shell == (char *)0x0) {
          return 0x1b;
        }
        bVar1 = true;
      }
    }
    else {
      bVar1 = true;
    }
    if (pw.pw_shell == (char *)0x0) {
      return 1;
    }
    file = (FILE *)curl_maprintf("%s%s%s",pw.pw_shell,"/",".netrc");
    if (bVar1) {
      (*Curl_cfree)(pw.pw_shell);
    }
    if (file == (FILE *)0x0) {
      return -1;
    }
    bVar1 = true;
  }
  __stream = fopen64((char *)file,"r");
  if (bVar1) {
    (*Curl_cfree)(file);
  }
  if (__stream == (FILE *)0x0) {
    return 1;
  }
  bVar1 = false;
  do {
    do {
      bVar9 = false;
      if (!bVar1) {
        pcVar7 = fgets(local_14c8,0x1000,__stream);
        bVar9 = pcVar7 != (char *)0x0;
      }
      if (!bVar9) {
LAB_006b2b19:
        if (login._4_4_ == 0) {
          if (bVar3) {
            if (*loginp != (char *)0x0) {
              (*Curl_cfree)(*loginp);
            }
            *loginp = password;
          }
          if (bVar5) {
            if (*passwordp != (char *)0x0) {
              (*Curl_cfree)(*passwordp);
            }
            *passwordp = _state;
          }
        }
        else {
          if (bVar3) {
            (*Curl_cfree)(password);
          }
          if (bVar5) {
            (*Curl_cfree)(_state);
          }
        }
        fclose(__stream);
        return login._4_4_;
      }
      tok_buf = strtok_r(local_14c8," \t\n",(char **)&stack0xfffffffffffffb48);
    } while ((tok_buf != (char *)0x0) && (*tok_buf == '#'));
    while (!bVar1 && tok_buf != (char *)0x0) {
      if ((((password != (char *)0x0) && (*password != '\0')) && (_state != (char *)0x0)) &&
         (*_state != '\0')) {
        bVar1 = true;
        break;
      }
      if (state_our_login == 0) {
        iVar6 = Curl_strcasecompare("machine",tok_buf);
        if (iVar6 == 0) {
          iVar6 = Curl_strcasecompare("default",tok_buf);
          if (iVar6 != 0) {
            state_our_login = 2;
            login._4_4_ = 0;
          }
        }
        else {
          state_our_login = 1;
        }
      }
      else if (state_our_login == 1) {
        iVar6 = Curl_strcasecompare(host,tok_buf);
        if (iVar6 == 0) {
          state_our_login = 0;
        }
        else {
          state_our_login = 2;
          login._4_4_ = 0;
        }
      }
      else if (state_our_login == 2) {
        if (bVar2) {
          if (bVar8) {
            local_60 = Curl_strcasecompare(password,tok_buf);
          }
          else {
            if (bVar3) {
              (*Curl_cfree)(password);
              bVar3 = false;
            }
            password = (*Curl_cstrdup)(tok_buf);
            if (password == (char *)0x0) {
              login._4_4_ = -1;
              goto LAB_006b2b19;
            }
            bVar3 = true;
          }
          bVar2 = false;
        }
        else if (bVar4) {
          if ((local_60 != 0) || (!bVar8)) {
            if (bVar5) {
              (*Curl_cfree)(_state);
              bVar5 = false;
            }
            _state = (*Curl_cstrdup)(tok_buf);
            if (_state == (char *)0x0) {
              login._4_4_ = -1;
              goto LAB_006b2b19;
            }
            bVar5 = true;
          }
          bVar4 = false;
        }
        else {
          iVar6 = Curl_strcasecompare("login",tok_buf);
          if (iVar6 == 0) {
            iVar6 = Curl_strcasecompare("password",tok_buf);
            if (iVar6 == 0) {
              iVar6 = Curl_strcasecompare("machine",tok_buf);
              if (iVar6 != 0) {
                state_our_login = 1;
                local_60 = 0;
              }
            }
            else {
              bVar4 = true;
            }
          }
          else {
            bVar2 = true;
          }
        }
      }
      tok_buf = strtok_r((char *)0x0," \t\n",(char **)&stack0xfffffffffffffb48);
    }
  } while( true );
}

Assistant:

int Curl_parsenetrc(const char *host,
                    char **loginp,
                    char **passwordp,
                    char *netrcfile)
{
  FILE *file;
  int retcode = 1;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  bool netrc_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = FALSE;  /* With specific_login, found *our* login
                                   name */

#define NETRC DOT_CHAR "netrc"

  if(!netrcfile) {
    bool home_alloc = FALSE;
    char *home = curl_getenv("HOME"); /* portable environment reader */
    if(home) {
      home_alloc = TRUE;
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd pw, *pw_res;
      char pwbuf[1024];
      if(!getpwuid_r(geteuid(), &pw, pwbuf, sizeof(pwbuf), &pw_res)
         && pw_res) {
        home = strdup(pw.pw_dir);
        if(!home)
          return CURLE_OUT_OF_MEMORY;
        home_alloc = TRUE;
      }
#elif defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw = getpwuid(geteuid());
      if(pw) {
        home = pw->pw_dir;
      }
#endif
    }

    if(!home)
      return retcode; /* no home directory found (or possibly out of memory) */

    netrcfile = curl_maprintf("%s%s%s", home, DIR_CHAR, NETRC);
    if(home_alloc)
      free(home);
    if(!netrcfile) {
      return -1;
    }
    netrc_alloc = TRUE;
  }

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(netrc_alloc)
    free(netrcfile);
  if(file) {
    char *tok;
    char *tok_buf;
    bool done = FALSE;
    char netrcbuffer[4096];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok = strtok_r(netrcbuffer, " \t\n", &tok_buf);
      if(tok && *tok == '#')
        /* treat an initial hash as a comment line */
        continue;
      while(!done && tok) {

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = 0; /* we did find our host */
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = 0; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = strcasecompare(login, tok);
            }
            else {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = -1; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if(state_our_login || !specific_login) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = -1; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    out:
    if(!retcode) {
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}